

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O3

void Set_LTWH_Anims_On(Am_Object *obj,Am_Slot_Key color_slot,bool wh)

{
  ushort uVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  ushort uVar3;
  Am_Object animlt;
  Am_Object animc;
  Am_Object local_30;
  Am_Object local_28;
  
  uVar3 = (ushort)obj;
  Am_Object::Get(uVar3,100);
  Am_Object::Get(uVar3,0x65);
  if ((int)CONCAT71(in_register_00000011,wh) != 0) {
    Am_Object::Get(uVar3,0x66);
    Am_Object::Get(uVar3,0x67);
  }
  Am_Object::Create((char *)&local_30);
  uVar2 = Am_Animate_With(&local_30);
  uVar1 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,uVar2);
  uVar2 = Am_Animate_With(&local_30);
  Am_Object::Set(uVar1,(Am_Constraint *)0x65,uVar2);
  if (wh) {
    uVar2 = Am_Animate_With(&local_30);
    uVar1 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,uVar2);
    uVar2 = Am_Animate_With(&local_30);
    Am_Object::Set(uVar1,(Am_Constraint *)0x67,uVar2);
  }
  if (color_slot != 0) {
    Am_Object::Create((char *)&local_28);
    uVar2 = Am_Animate_With(&local_28);
    Am_Object::Set(uVar3,(Am_Constraint *)(ulong)color_slot,uVar2);
    Am_Object::~Am_Object(&local_28);
  }
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

void
Set_LTWH_Anims_On(Am_Object &obj, Am_Slot_Key color_slot, bool wh)
{
  obj.Get(Am_LEFT); //evaluate these before putting in the animation
  obj.Get(Am_TOP);  //evaluate these before putting in the animation
  if (wh) {
    obj.Get(Am_WIDTH);  //evaluate these before putting in the animation
    obj.Get(Am_HEIGHT); //evaluate these before putting in the animation
  }
  Am_Object animlt = animator_proto.Create();
  obj.Set(Am_LEFT, Am_Animate_With(animlt))
      .Set(Am_TOP, Am_Animate_With(animlt));
  if (wh) {
    obj.Set(Am_WIDTH, Am_Animate_With(animlt))
        .Set(Am_HEIGHT, Am_Animate_With(animlt));
  }
  if (color_slot) {
    Am_Object animc = color_anim_proto.Create("line_color_anim");
    obj.Set(color_slot, Am_Animate_With(animc));
  }
}